

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManEquivRemapDfs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar4;
  long lVar5;
  Vec_Int_t *p_01;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  size_t __nmemb;
  
  p_00 = Gia_ManDupDfs(p);
  iVar1 = p_00->nObjs;
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p_00->pReprs = pGVar4;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      p_00->pReprs[lVar5] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar5] | 0xfffffff);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p_00->nObjs);
  }
  if (1 < p->nObjs) {
    lVar5 = 1;
    lVar8 = 5;
    do {
      if (((uint)p->pReprs[lVar5] & 0xfffffff) == 0) {
        uVar10 = *(uint *)(&p->pObjs->field_0x0 + lVar8 * 4);
        if ((int)uVar10 < 0) {
LAB_001feabc:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar10 < 2) {
LAB_001feadb:
          __assert_fail("Num == GIA_VOID || Num < Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
        }
        p_00->pReprs[uVar10 >> 1] = (Gia_Rpr_t)((uint)p_00->pReprs[uVar10 >> 1] & 0xf0000000);
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar5 < p->nObjs);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_01->pArray = piVar6;
  if (1 < p->nObjs) {
    uVar12 = 1;
    do {
      if ((((uint)p->pReprs[uVar12] & 0xfffffff) == 0xfffffff) && (0 < p->pNexts[uVar12])) {
        p_01->nSize = 0;
        if (p->pNexts[uVar12] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x3b7,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
        }
        uVar7 = uVar12 & 0xffffffff;
        do {
          if (p->nObjs <= (int)uVar7) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar10 = p->pObjs[uVar7].Value;
          if ((int)uVar10 < 0) goto LAB_001feabc;
          uVar10 = uVar10 >> 1;
          if (0 < (long)p_01->nSize) {
            lVar5 = 0;
            do {
              if (p_01->pArray[lVar5] == uVar10) goto LAB_001fe9e0;
              lVar5 = lVar5 + 1;
            } while (p_01->nSize != lVar5);
          }
          Vec_IntPush(p_01,uVar10);
LAB_001fe9e0:
          puVar3 = (uint *)(p->pNexts + uVar7);
          uVar7 = (ulong)*puVar3;
        } while (0 < (int)*puVar3);
        __nmemb = (size_t)p_01->nSize;
        if ((long)__nmemb < 2) {
          __assert_fail("Vec_IntSize( vClass ) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x3b9,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
        }
        puVar3 = (uint *)p_01->pArray;
        qsort(puVar3,__nmemb,4,Vec_IntSortCompare1);
        uVar10 = *puVar3;
        sVar9 = 1;
        uVar11 = uVar10;
        do {
          uVar2 = puVar3[sVar9];
          if ((uVar10 != 0xfffffff) && ((int)uVar2 <= (int)uVar10)) goto LAB_001feadb;
          p_00->pReprs[(int)uVar2] =
               (Gia_Rpr_t)((uint)p_00->pReprs[(int)uVar2] & 0xf0000000 | uVar10 & 0xfffffff);
          if ((int)uVar2 <= (int)uVar11) {
            __assert_fail("iPrev < iNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x3bf,"Gia_Man_t *Gia_ManEquivRemapDfs(Gia_Man_t *)");
          }
          sVar9 = sVar9 + 1;
          uVar11 = uVar2;
        } while (__nmemb != sVar9);
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)p->nObjs);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  piVar6 = Gia_ManDeriveNexts(p_00);
  p_00->pNexts = piVar6;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManEquivRemapDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr, iPrev;
    pNew = Gia_ManDupDfs( p );
    // start representatives
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
    for ( i = 0; i < Gia_ManObjNum(pNew); i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );
    // iterate over constant candidates
    Gia_ManForEachConst( p, i )
        Gia_ObjSetRepr( pNew, Abc_Lit2Var(Gia_ManObj(p, i)->Value), 0 );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        Gia_ClassForEachObj( p, i, k )
            Vec_IntPushUnique( vClass, Abc_Lit2Var(Gia_ManObj(p, k)->Value) );
        assert( Vec_IntSize( vClass ) > 1 );
        Vec_IntSort( vClass, 0 );
        iRepr = iPrev = Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntryStart( vClass, iNode, k, 1 )
        {
            Gia_ObjSetRepr( pNew, iNode, iRepr );
            assert( iPrev < iNode );
            iPrev = iNode;
        }
    }
    Vec_IntFree( vClass );
    pNew->pNexts = Gia_ManDeriveNexts( pNew );
    return pNew;
}